

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::SortByMaterials_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData,
          IntSplitGroupData_MDL7 *splitGroupData)

{
  pointer paVar1;
  pointer ppaVar2;
  uint m;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  Logger *pLVar7;
  MDLImporter *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar8;
  pointer pIVar9;
  pointer pIVar10;
  MDLImporter *this_01;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *this_02;
  ulong uVar11;
  uint o;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint local_9c;
  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> avMats;
  IntMaterial_MDL7 sHelper;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  aiTempSplit;
  
  uVar11 = (long)(splitGroupData->shared->pcMats).
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(splitGroupData->shared->pcMats).
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar12 = (long)uVar11 >> 3;
  uVar5 = (uint)uVar12;
  if (groupData->bNeed2UV == false) {
    paVar1 = (groupData->vTextureCoords2).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((groupData->vTextureCoords2).
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish != paVar1) {
      (groupData->vTextureCoords2).
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar1;
    }
    ppvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              operator_new__(uVar11 & 0x7fffffff8);
    splitGroupData->aiSplit = ppvVar8;
    for (uVar11 = 0; (uVar12 & 0xffffffff) != uVar11; uVar11 = uVar11 + 1) {
      pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      splitGroupData->aiSplit[uVar11] = pvVar6;
    }
    uVar3 = 0;
    while (avMats.
           super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
           ._M_impl.super__Vector_impl_data._M_start =
                (pointer)CONCAT44(avMats.
                                  super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar3),
          uVar3 < (uint)groupInfo->pcGroup->numtris) {
      uVar3 = (groupData->pcFaces).
              super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3].iMatIndex[0];
      if (uVar3 < uVar5) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (splitGroupData->aiSplit[uVar3],(value_type_conflict1 *)&avMats);
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (splitGroupData->aiSplit[uVar5 - 1],(value_type_conflict1 *)&avMats);
        if ((groupData->pcFaces).
            super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
            ._M_impl.super__Vector_impl_data._M_start
            [(ulong)avMats.
                    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff].iMatIndex[0] !=
            0xffffffff) {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"Index overflow in MDL7 material list [#0]");
        }
      }
      uVar3 = (int)avMats.
                   super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  else {
    avMats.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    avMats.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avMats.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar11 = (ulong)((uint)(uVar11 >> 2) & 0xfffffffe);
    std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>::
    reserve(&avMats,uVar11);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::vector(&aiTempSplit,uVar11,(allocator_type *)&sHelper);
    uVar11 = uVar12 & 0xffffffff;
    for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
      pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      aiTempSplit.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar14] = pvVar6;
    }
    uVar3 = uVar5 - 1;
    for (local_9c = 0; local_9c < (uint)groupInfo->pcGroup->numtris; local_9c = local_9c + 1) {
      uVar14 = (ulong)local_9c;
      pIVar9 = (groupData->pcFaces).
               super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = pIVar9[uVar14].iMatIndex[0];
      uVar13 = uVar15;
      if ((uVar5 <= uVar15) && (uVar13 = uVar3, uVar15 != 0xffffffff)) {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"Index overflow in MDL7 material list [#1]");
        uVar14 = (ulong)local_9c;
        pIVar9 = (groupData->pcFaces).
                 super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar15 = pIVar9[uVar14].iMatIndex[1];
      uVar14 = (ulong)uVar13;
      if ((uVar15 != 0xffffffff) && (uVar13 != uVar15)) {
        if (uVar5 <= uVar15) {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"Index overflow in MDL7 material list [#2]");
          uVar15 = uVar3;
        }
        uVar4 = 0;
        for (pIVar10 = avMats.
                       super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pIVar10 !=
            avMats.
            super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
            ._M_impl.super__Vector_impl_data._M_finish; pIVar10 = pIVar10 + 1) {
          if ((pIVar10->iOldMatIndices[0] == uVar13) && (pIVar10->iOldMatIndices[1] == uVar15))
          goto LAB_004268e2;
          uVar4 = uVar4 + 1;
        }
        sHelper.pcMat = (aiMaterial *)0x0;
        sHelper.iOldMatIndices[0] = 0;
        sHelper.iOldMatIndices[1] = 0;
        this_00 = (MDLImporter *)operator_new(0x10);
        this_01 = this_00;
        aiMaterial::aiMaterial((aiMaterial *)this_00);
        sHelper.iOldMatIndices[1] = uVar15;
        sHelper.iOldMatIndices[0] = uVar13;
        ppaVar2 = (splitGroupData->shared->pcMats).
                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sHelper.pcMat = (aiMaterial *)this_00;
        JoinSkins_3DGS_MDL7(this_01,ppaVar2[uVar14],ppaVar2[uVar15],(aiMaterial *)this_00);
        std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>::
        push_back(&avMats,&sHelper);
        uVar4 = (int)((ulong)((long)avMats.
                                    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)avMats.
                                   super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
LAB_004268e2:
        uVar14 = (ulong)uVar4;
        if ((long)aiTempSplit.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)aiTempSplit.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar14) {
          sHelper.pcMat = (aiMaterial *)operator_new(0x18);
          (sHelper.pcMat)->mProperties = (aiMaterialProperty **)0x0;
          (sHelper.pcMat)->mNumProperties = 0;
          (sHelper.pcMat)->mNumAllocated = 0;
          sHelper.pcMat[1].mProperties = (aiMaterialProperty **)0x0;
          std::
          vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
          ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                    ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                      *)&aiTempSplit,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&sHelper);
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (aiTempSplit.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14],&local_9c);
    }
    this_02 = &splitGroupData->shared->pcMats;
    if (groupInfo->iIndex == 0) {
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::resize
                (this_02,(long)avMats.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)avMats.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar5 = 0;
      while( true ) {
        uVar12 = (ulong)uVar5;
        if ((ulong)((long)avMats.
                          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)avMats.
                          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar12) break;
        (splitGroupData->shared->pcMats).
        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12] =
             avMats.
             super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar12].pcMat;
        uVar5 = uVar5 + 1;
      }
    }
    else {
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::resize
                (this_02,((long)avMats.
                                super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)avMats.
                                super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) +
                         (uVar12 & 0xffffffff));
      while( true ) {
        uVar14 = uVar12 & 0xffffffff;
        if ((ulong)((long)avMats.
                          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)avMats.
                          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar14) break;
        (splitGroupData->shared->pcMats).
        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar14] =
             avMats.
             super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14].pcMat;
        uVar12 = (ulong)((int)uVar12 + 1);
      }
    }
    uVar12 = 0xffffffffffffffff;
    if (-1 < (long)aiTempSplit.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)aiTempSplit.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = (long)aiTempSplit.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)aiTempSplit.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    ppvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)operator_new__(uVar12);
    splitGroupData->aiSplit = ppvVar8;
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      splitGroupData->aiSplit[uVar12] =
           aiTempSplit.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar12];
    }
    std::
    _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::~_Vector_base(&aiTempSplit.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   );
    std::_Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ::~_Vector_base(&avMats.
                     super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                   );
  }
  return;
}

Assistant:

void MDLImporter::SortByMaterials_3DGS_MDL7(
    const MDL::IntGroupInfo_MDL7&   groupInfo,
    MDL::IntGroupData_MDL7&         groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const unsigned int iNumMaterials = (unsigned int)splitGroupData.shared.pcMats.size();
    if (!groupData.bNeed2UV)    {
        // if we don't need a second set of texture coordinates there is no reason to keep it in memory ...
        groupData.vTextureCoords2.clear();

        // allocate the array
        splitGroupData.aiSplit = new std::vector<unsigned int>*[iNumMaterials];

        for (unsigned int m = 0; m < iNumMaterials;++m)
            splitGroupData.aiSplit[m] = new std::vector<unsigned int>();

        // iterate through all faces and sort by material
        for (unsigned int iFace = 0; iFace < (unsigned int)groupInfo.pcGroup->numtris;++iFace)  {
            // check range
            if (groupData.pcFaces[iFace].iMatIndex[0] >= iNumMaterials) {
                // use the last material instead
                splitGroupData.aiSplit[iNumMaterials-1]->push_back(iFace);

                // sometimes MED writes -1, but normally only if there is only
                // one skin assigned. No warning in this case
                if(0xFFFFFFFF != groupData.pcFaces[iFace].iMatIndex[0])
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#0]");
            }
            else splitGroupData.aiSplit[groupData.pcFaces[iFace].
                iMatIndex[0]]->push_back(iFace);
        }
    }
    else
    {
        // we need to build combined materials for each combination of
        std::vector<MDL::IntMaterial_MDL7> avMats;
        avMats.reserve(iNumMaterials*2);

        // fixme: why on the heap?
        std::vector<std::vector<unsigned int>* > aiTempSplit(iNumMaterials*2);
        for (unsigned int m = 0; m < iNumMaterials;++m)
            aiTempSplit[m] = new std::vector<unsigned int>();

        // iterate through all faces and sort by material
        for (unsigned int iFace = 0; iFace < (unsigned int)groupInfo.pcGroup->numtris;++iFace)  {
            // check range
            unsigned int iMatIndex = groupData.pcFaces[iFace].iMatIndex[0];
            if (iMatIndex >= iNumMaterials) {
                // sometimes MED writes -1, but normally only if there is only
                // one skin assigned. No warning in this case
                if(UINT_MAX != iMatIndex)
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#1]");
                iMatIndex = iNumMaterials-1;
            }
            unsigned int iMatIndex2 = groupData.pcFaces[iFace].iMatIndex[1];

            unsigned int iNum = iMatIndex;
            if (UINT_MAX != iMatIndex2 && iMatIndex != iMatIndex2)  {
                if (iMatIndex2 >= iNumMaterials)    {
                    // sometimes MED writes -1, but normally only if there is only
                    // one skin assigned. No warning in this case
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#2]");
                    iMatIndex2 = iNumMaterials-1;
                }

                // do a slow search in the list ...
                iNum = 0;
                bool bFound = false;
                for (std::vector<MDL::IntMaterial_MDL7>::iterator i =  avMats.begin();i != avMats.end();++i,++iNum){
                    if ((*i).iOldMatIndices[0] == iMatIndex && (*i).iOldMatIndices[1] == iMatIndex2)    {
                        // reuse this material
                        bFound = true;
                        break;
                    }
                }
                if (!bFound)    {
                    //  build a new material ...
                    MDL::IntMaterial_MDL7 sHelper;
                    sHelper.pcMat = new aiMaterial();
                    sHelper.iOldMatIndices[0] = iMatIndex;
                    sHelper.iOldMatIndices[1] = iMatIndex2;
                    JoinSkins_3DGS_MDL7(splitGroupData.shared.pcMats[iMatIndex],
                        splitGroupData.shared.pcMats[iMatIndex2],sHelper.pcMat);

                    // and add it to the list
                    avMats.push_back(sHelper);
                    iNum = (unsigned int)avMats.size()-1;
                }
                // adjust the size of the file array
                if (iNum == aiTempSplit.size()) {
                    aiTempSplit.push_back(new std::vector<unsigned int>());
                }
            }
            aiTempSplit[iNum]->push_back(iFace);
        }

        // now add the newly created materials to the old list
        if (0 == groupInfo.iIndex)  {
            splitGroupData.shared.pcMats.resize(avMats.size());
            for (unsigned int o = 0; o < avMats.size();++o)
                splitGroupData.shared.pcMats[o] = avMats[o].pcMat;
        }
        else    {
            // This might result in redundant materials ...
            splitGroupData.shared.pcMats.resize(iNumMaterials + avMats.size());
            for (unsigned int o = iNumMaterials; o < avMats.size();++o)
                splitGroupData.shared.pcMats[o] = avMats[o].pcMat;
        }

        // and build the final face-to-material array
        splitGroupData.aiSplit = new std::vector<unsigned int>*[aiTempSplit.size()];
        for (unsigned int m = 0; m < iNumMaterials;++m)
            splitGroupData.aiSplit[m] = aiTempSplit[m];
    }
}